

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  undefined8 uVar2;
  size_t sVar3;
  uchar *__ptr;
  long size;
  char local_1098 [8];
  char msg [4119];
  char local_78 [8];
  char format [23];
  string local_50;
  FILE *local_30;
  FILE *infile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  string_view filename_local;
  
  infile = (FILE *)filename.size_;
  filename_local.data_ = filename.data_;
  out_data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  string_view::to_string_abi_cxx11_(&local_50,(string_view *)&out_data_local);
  __filename = (char *)std::__cxx11::string::c_str((string *)&local_50);
  __stream = fopen(__filename,"rb");
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = __stream;
  if (__stream == (FILE *)0x0) {
    builtin_strncpy(local_78,"unable t",8);
    builtin_strncpy(format,"o read file %s",0xf);
    string_view::to_string_abi_cxx11_((string *)&size,(string_view *)&out_data_local);
    uVar2 = std::__cxx11::string::c_str((string *)&size);
    snprintf(local_1098,0x1017,local_78,uVar2);
    std::__cxx11::string::~string((string *)&size);
    perror(local_1098);
    Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 < 0) {
      perror("fseek to end failed");
      fclose(local_30);
      Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
    }
    else {
      sVar3 = ftell(local_30);
      if ((long)sVar3 < 0) {
        perror("ftell failed");
        fclose(local_30);
        Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
      }
      else {
        iVar1 = fseek(local_30,0,0);
        if (iVar1 < 0) {
          perror("fseek to beginning failed");
          fclose(local_30);
          Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)infile,sVar3);
          if (sVar3 != 0) {
            __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)infile);
            sVar3 = fread(__ptr,sVar3,1,local_30);
            if (sVar3 != 1) {
              perror("fread failed");
              fclose(local_30);
              Result::Result((Result *)((long)&filename_local.size_ + 4),Error);
              return (Result)filename_local.size_._4_4_;
            }
          }
          fclose(local_30);
          Result::Result((Result *)((long)&filename_local.size_ + 4),Ok);
        }
      }
    }
  }
  return (Result)filename_local.size_._4_4_;
}

Assistant:

Result ReadFile(string_view filename, std::vector<uint8_t>* out_data) {
  FILE* infile = fopen(filename.to_string().c_str(), "rb");
  if (!infile) {
    const char format[] = "unable to read file %s";
    char msg[PATH_MAX + sizeof(format)];
    wabt_snprintf(msg, sizeof(msg), format, filename.to_string().c_str());
    perror(msg);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    perror("fread failed");
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}